

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O1

REF_STATUS ref_recon_max_jump_limit(REF_DBL *recon,REF_GRID ref_grid,REF_DBL max_jump)

{
  REF_NODE ref_node;
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  REF_DBL *pRVar5;
  REF_CELL ref_cell;
  double dVar6;
  double dVar7;
  double dVar8;
  REF_INT nnode;
  REF_DBL diag_system [12];
  REF_INT node_list [1000];
  int local_106c;
  double local_1068;
  REF_DBL *local_1060;
  double local_1058;
  double local_1048;
  double local_1038;
  double local_1030;
  double local_1028;
  REF_INT local_fd8 [1002];
  
  ref_node = ref_grid->node;
  if (ref_grid->twod == 0) {
    ref_cell = ref_grid->cell[8];
  }
  else {
    ref_cell = ref_grid->cell[3];
  }
  local_1060 = recon;
  if (0 < ref_node->max) {
    local_1058 = max_jump * 4.0;
    local_1048 = local_1058;
    if (local_1058 <= -local_1058) {
      local_1048 = -local_1058;
    }
    lVar3 = 0;
    do {
      if (-1 < ref_node->global[lVar3]) {
        uVar1 = ref_cell_node_list_around(ref_cell,(REF_INT)lVar3,1000,&local_106c,local_fd8);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x517,"ref_recon_max_jump_limit",(ulong)uVar1,"first halo of nodes");
          return uVar1;
        }
        if (local_106c < 1) {
          dVar8 = 0.0;
        }
        else {
          dVar8 = 0.0;
          lVar4 = 0;
          do {
            pRVar5 = ref_node->real;
            lVar2 = (long)local_fd8[lVar4];
            dVar6 = (pRVar5[lVar2 * 0xf + 2] - pRVar5[lVar3 * 0xf + 2]) *
                    (pRVar5[lVar2 * 0xf + 2] - pRVar5[lVar3 * 0xf + 2]) +
                    (pRVar5[lVar2 * 0xf + 1] - pRVar5[lVar3 * 0xf + 1]) *
                    (pRVar5[lVar2 * 0xf + 1] - pRVar5[lVar3 * 0xf + 1]) +
                    (pRVar5[lVar2 * 0xf] - pRVar5[lVar3 * 0xf]) *
                    (pRVar5[lVar2 * 0xf] - pRVar5[lVar3 * 0xf]);
            if (dVar6 < 0.0) {
              local_1068 = dVar8;
              dVar6 = sqrt(dVar6);
              dVar8 = local_1068;
            }
            else {
              dVar6 = SQRT(dVar6);
            }
            dVar7 = dVar6;
            if (lVar4 != 0) {
              dVar7 = dVar8;
            }
            dVar8 = dVar7;
            if (dVar6 <= dVar7) {
              dVar8 = dVar6;
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 < local_106c);
        }
        dVar6 = dVar8 * 1e+20 * dVar8;
        if (dVar6 <= -dVar6) {
          dVar6 = -dVar6;
        }
        if (local_1048 < dVar6) {
          pRVar5 = local_1060 + lVar3 * 6;
          local_1068 = dVar8;
          uVar1 = ref_matrix_diag_m(pRVar5,&local_1038);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x52a,"ref_recon_max_jump_limit",(ulong)uVar1,"eigen decomp");
            return uVar1;
          }
          dVar8 = local_1058 / (local_1068 * local_1068);
          if (dVar8 <= local_1038) {
            local_1038 = dVar8;
          }
          if (dVar8 <= local_1030) {
            local_1030 = dVar8;
          }
          if (dVar8 <= local_1028) {
            local_1028 = dVar8;
          }
          uVar1 = ref_matrix_form_m(&local_1038,pRVar5);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x531,"ref_recon_max_jump_limit",(ulong)uVar1,"re-form hess");
            return uVar1;
          }
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < ref_node->max);
  }
  uVar1 = ref_node_ghost_dbl(ref_node,local_1060,6);
  if (uVar1 == 0) {
    uVar1 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x535,
           "ref_recon_max_jump_limit",(ulong)uVar1,"update ghosts");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_recon_max_jump_limit(REF_DBL *recon, REF_GRID ref_grid,
                                            REF_DBL max_jump) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node;
  REF_DBL radius, dist;
  REF_DBL eig_ceiling;
  REF_INT nnode, node_list[REF_RECON_MAX_DEGREE],
      max_node = REF_RECON_MAX_DEGREE;
  REF_DBL diag_system[12];

  if (ref_grid_twod(ref_grid)) ref_cell = ref_grid_tri(ref_grid);

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_cell_node_list_around(ref_cell, node, max_node, &nnode, node_list),
        "first halo of nodes");
    radius = 0.0;
    for (i = 0; i < nnode; i++) {
      dist = sqrt(pow(ref_node_xyz(ref_node, 0, node_list[i]) -
                          ref_node_xyz(ref_node, 0, node),
                      2) +
                  pow(ref_node_xyz(ref_node, 1, node_list[i]) -
                          ref_node_xyz(ref_node, 1, node),
                      2) +
                  pow(ref_node_xyz(ref_node, 2, node_list[i]) -
                          ref_node_xyz(ref_node, 2, node),
                      2));
      if (i == 0) radius = dist;
      radius = MIN(radius, dist);
    }
    /* 2nd order central finite difference */
    if (ref_math_divisible(4 * max_jump, radius * radius)) {
      eig_ceiling = (4 * max_jump) / (radius * radius);

      RSS(ref_matrix_diag_m(&(recon[6 * node]), diag_system), "eigen decomp");
      ref_matrix_eig(diag_system, 0) =
          MIN(ref_matrix_eig(diag_system, 0), eig_ceiling);
      ref_matrix_eig(diag_system, 1) =
          MIN(ref_matrix_eig(diag_system, 1), eig_ceiling);
      ref_matrix_eig(diag_system, 2) =
          MIN(ref_matrix_eig(diag_system, 2), eig_ceiling);
      RSS(ref_matrix_form_m(diag_system, &(recon[6 * node])), "re-form hess");
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, recon, 6), "update ghosts");

  return REF_SUCCESS;
}